

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

char * embree::Texture::format_to_string(Format format)

{
  runtime_error *this;
  int in_EDI;
  char *local_8;
  
  if (in_EDI == 1) {
    local_8 = "RGBA8";
  }
  else if (in_EDI == 2) {
    local_8 = "RGB8";
  }
  else {
    if (in_EDI != 3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"invalid texture format");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_8 = "FLOAT32";
  }
  return local_8;
}

Assistant:

const char* Texture::format_to_string(const Format format)
  {
    switch (format) {
    case RGBA8  : return "RGBA8";
    case RGB8   : return "RGB8";
    case FLOAT32: return "FLOAT32";
    default     : THROW_RUNTIME_ERROR("invalid texture format");
    }
  }